

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRRLoader.cpp
# Opt level: O1

void __thiscall
Assimp::IRRImporter::BuildSkybox
          (IRRImporter *this,vector<aiMesh_*,_std::allocator<aiMesh_*>_> *meshes,
          vector<aiMaterial_*,_std::allocator<aiMaterial_*>_> *materials)

{
  int iVar1;
  IRRImporter *pIVar2;
  IRRImporter *pIVar3;
  uint i;
  long lVar4;
  int shading;
  aiString s;
  aiMesh *local_4b0;
  IRRImporter *local_4a8;
  SkyboxVertex local_4a0;
  SkyboxVertex local_47c;
  SkyboxVertex local_458;
  undefined1 local_434 [20];
  float fStack_420;
  float fStack_41c;
  float fStack_418;
  float local_414;
  
  lVar4 = 0;
  local_4a8 = (IRRImporter *)meshes;
  do {
    pIVar2 = (IRRImporter *)
             (materials->super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl.
             super__Vector_impl_data._M_finish[lVar4 + -6];
    local_434._0_8_ = local_434._0_8_ & 0xffffff0000000000;
    memset(local_434 + 5,0x1b,0x3ff);
    iVar1 = snprintf(local_434 + 4,0x400,"SkyboxSide_%u");
    local_434._0_4_ = iVar1;
    aiMaterial::AddProperty((aiMaterial *)pIVar2,(aiString *)local_434,"?mat.name",0,0);
    local_4a0.position.x = 1.26117e-44;
    aiMaterial::AddBinaryProperty
              ((aiMaterial *)pIVar2,&local_4a0,4,"$mat.shadingm",0,0,aiPTI_Integer);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  local_434._0_4_ = 0xc1200000;
  local_434[4] = '\0';
  local_434[5] = '\0';
  local_434[6] = ' ';
  local_434[7] = -0x3f;
  local_434[8] = '\0';
  local_434[9] = '\0';
  local_434[10] = ' ';
  local_434[0xb] = -0x3f;
  local_434[0xc] = '\0';
  local_434[0xd] = '\0';
  local_434[0xe] = '\0';
  local_434[0xf] = '\0';
  local_434._16_4_ = 0.0;
  fStack_420 = 1.0;
  fStack_41c = 1.0;
  fStack_418 = 1.0;
  local_414 = 0.0;
  local_4a0.position.x = 10.0;
  local_4a0.position.y = -10.0;
  local_4a0.position.z = -10.0;
  local_4a0.normal.x = 0.0;
  local_4a0.normal.y = 0.0;
  local_4a0.normal.z = 1.0;
  local_4a0.uv.x = 0.0;
  local_4a0.uv.y = 1.0;
  local_4a0.uv.z = 0.0;
  local_458.position.x = 10.0;
  local_458.position.y = 10.0;
  local_458.position.z = -10.0;
  local_458.normal.x = 0.0;
  local_458.normal.y = 0.0;
  local_458.normal.z = 1.0;
  local_458.uv.x = 0.0;
  local_458.uv.y = 0.0;
  local_458.uv.z = 0.0;
  local_47c.position.x = -10.0;
  local_47c.position.y = 10.0;
  local_47c.position.z = -10.0;
  local_47c.normal.x = 0.0;
  local_47c.normal.y = 0.0;
  local_47c.normal.z = 1.0;
  local_47c.uv.x = 1.0;
  local_47c.uv.y = 0.0;
  local_47c.uv.z = 0.0;
  local_4b0 = BuildSingleQuadMesh(pIVar2,(SkyboxVertex *)local_434,&local_4a0,&local_458,&local_47c)
  ;
  pIVar2 = local_4a8;
  pIVar3 = local_4a8;
  std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
            ((vector<aiMesh*,std::allocator<aiMesh*>> *)local_4a8,&local_4b0);
  *(int *)(*(long *)(*(long *)&(pIVar2->super_BaseImporter).importerUnits._M_t._M_impl + -8) + 0xe8)
       = (int)((ulong)((long)(materials->
                             super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(materials->
                            super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl
                            .super__Vector_impl_data._M_start) >> 3) + -6;
  local_434._0_4_ = 0x41200000;
  local_434[4] = '\0';
  local_434[5] = '\0';
  local_434[6] = ' ';
  local_434[7] = -0x3f;
  local_434[8] = '\0';
  local_434[9] = '\0';
  local_434[10] = ' ';
  local_434[0xb] = -0x3f;
  local_434[0xc] = '\0';
  local_434[0xd] = '\0';
  local_434[0xe] = -0x80;
  local_434[0xf] = -0x41;
  local_434._16_4_ = 0.0;
  fStack_420 = 0.0;
  fStack_41c = 1.0;
  fStack_418 = 1.0;
  local_414 = 0.0;
  local_4a0.position.x = 10.0;
  local_4a0.position.y = -10.0;
  local_4a0.position.z = 10.0;
  local_4a0.normal.x = -1.0;
  local_4a0.normal.y = 0.0;
  local_4a0.normal.z = 0.0;
  local_4a0.uv.x = 0.0;
  local_4a0.uv.y = 1.0;
  local_4a0.uv.z = 0.0;
  local_458.position.x = 10.0;
  local_458.position.y = 10.0;
  local_458.position.z = 10.0;
  local_458.normal.x = -1.0;
  local_458.normal.y = 0.0;
  local_458.normal.z = 0.0;
  local_458.uv.x = 0.0;
  local_458.uv.y = 0.0;
  local_458.uv.z = 0.0;
  local_47c.position.x = 10.0;
  local_47c.position.y = 10.0;
  local_47c.position.z = -10.0;
  local_47c.normal.x = -1.0;
  local_47c.normal.y = 0.0;
  local_47c.normal.z = 0.0;
  local_47c.uv.x = 1.0;
  local_47c.uv.y = 0.0;
  local_47c.uv.z = 0.0;
  local_4b0 = BuildSingleQuadMesh(pIVar3,(SkyboxVertex *)local_434,&local_4a0,&local_458,&local_47c)
  ;
  pIVar3 = pIVar2;
  std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
            ((vector<aiMesh*,std::allocator<aiMesh*>> *)pIVar2,&local_4b0);
  *(int *)(*(long *)(*(long *)&(pIVar2->super_BaseImporter).importerUnits._M_t._M_impl + -8) + 0xe8)
       = (int)((ulong)((long)(materials->
                             super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(materials->
                            super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl
                            .super__Vector_impl_data._M_start) >> 3) + -5;
  local_434._0_4_ = 0x41200000;
  local_434[4] = '\0';
  local_434[5] = '\0';
  local_434[6] = ' ';
  local_434[7] = -0x3f;
  local_434[8] = '\0';
  local_434[9] = '\0';
  local_434[10] = ' ';
  local_434[0xb] = 'A';
  local_434[0xc] = '\0';
  local_434[0xd] = '\0';
  local_434[0xe] = '\0';
  local_434[0xf] = '\0';
  local_434._16_4_ = 0.0;
  fStack_420 = -1.0;
  fStack_41c = 1.0;
  fStack_418 = 1.0;
  local_414 = 0.0;
  local_4a0.position.x = -10.0;
  local_4a0.position.y = -10.0;
  local_4a0.position.z = 10.0;
  local_4a0.normal.x = 0.0;
  local_4a0.normal.y = 0.0;
  local_4a0.normal.z = -1.0;
  local_4a0.uv.x = 0.0;
  local_4a0.uv.y = 1.0;
  local_4a0.uv.z = 0.0;
  local_458.position.x = -10.0;
  local_458.position.y = 10.0;
  local_458.position.z = 10.0;
  local_458.normal.x = 0.0;
  local_458.normal.y = 0.0;
  local_458.normal.z = -1.0;
  local_458.uv.x = 0.0;
  local_458.uv.y = 0.0;
  local_458.uv.z = 0.0;
  local_47c.position.x = 10.0;
  local_47c.position.y = 10.0;
  local_47c.position.z = 10.0;
  local_47c.normal.x = 0.0;
  local_47c.normal.y = 0.0;
  local_47c.normal.z = -1.0;
  local_47c.uv.x = 1.0;
  local_47c.uv.y = 0.0;
  local_47c.uv.z = 0.0;
  local_4b0 = BuildSingleQuadMesh(pIVar3,(SkyboxVertex *)local_434,&local_4a0,&local_458,&local_47c)
  ;
  pIVar3 = pIVar2;
  std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
            ((vector<aiMesh*,std::allocator<aiMesh*>> *)pIVar2,&local_4b0);
  *(int *)(*(long *)(*(long *)&(pIVar2->super_BaseImporter).importerUnits._M_t._M_impl + -8) + 0xe8)
       = (int)((ulong)((long)(materials->
                             super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(materials->
                            super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl
                            .super__Vector_impl_data._M_start) >> 3) + -4;
  local_434._0_4_ = 0xc1200000;
  local_434[4] = '\0';
  local_434[5] = '\0';
  local_434[6] = ' ';
  local_434[7] = -0x3f;
  local_434[8] = '\0';
  local_434[9] = '\0';
  local_434[10] = ' ';
  local_434[0xb] = 'A';
  local_434[0xc] = '\0';
  local_434[0xd] = '\0';
  local_434[0xe] = -0x80;
  local_434[0xf] = '?';
  local_434._16_4_ = 0.0;
  fStack_420 = 0.0;
  fStack_41c = 1.0;
  fStack_418 = 1.0;
  local_414 = 0.0;
  local_4a0.position.x = -10.0;
  local_4a0.position.y = -10.0;
  local_4a0.position.z = -10.0;
  local_4a0.normal.x = 1.0;
  local_4a0.normal.y = 0.0;
  local_4a0.normal.z = 0.0;
  local_4a0.uv.x = 0.0;
  local_4a0.uv.y = 1.0;
  local_4a0.uv.z = 0.0;
  local_458.position.x = -10.0;
  local_458.position.y = 10.0;
  local_458.position.z = -10.0;
  local_458.normal.x = 1.0;
  local_458.normal.y = 0.0;
  local_458.normal.z = 0.0;
  local_458.uv.x = 0.0;
  local_458.uv.y = 0.0;
  local_458.uv.z = 0.0;
  local_47c.position.x = -10.0;
  local_47c.position.y = 10.0;
  local_47c.position.z = 10.0;
  local_47c.normal.x = 1.0;
  local_47c.normal.y = 0.0;
  local_47c.normal.z = 0.0;
  local_47c.uv.x = 1.0;
  local_47c.uv.y = 0.0;
  local_47c.uv.z = 0.0;
  local_4b0 = BuildSingleQuadMesh(pIVar3,(SkyboxVertex *)local_434,&local_4a0,&local_458,&local_47c)
  ;
  pIVar3 = pIVar2;
  std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
            ((vector<aiMesh*,std::allocator<aiMesh*>> *)pIVar2,&local_4b0);
  *(int *)(*(long *)(*(long *)&(pIVar2->super_BaseImporter).importerUnits._M_t._M_impl + -8) + 0xe8)
       = (int)((ulong)((long)(materials->
                             super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(materials->
                            super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl
                            .super__Vector_impl_data._M_start) >> 3) + -3;
  local_434._0_4_ = 0x41200000;
  local_434[4] = '\0';
  local_434[5] = '\0';
  local_434[6] = ' ';
  local_434[7] = 'A';
  local_434[8] = '\0';
  local_434[9] = '\0';
  local_434[10] = ' ';
  local_434[0xb] = -0x3f;
  local_434[0xc] = '\0';
  local_434[0xd] = '\0';
  local_434[0xe] = '\0';
  local_434[0xf] = '\0';
  local_434._16_4_ = -1.0;
  fStack_420 = 0.0;
  fStack_41c = 1.0;
  fStack_418 = 1.0;
  local_414 = 0.0;
  local_4a0.position.x = 10.0;
  local_4a0.position.y = 10.0;
  local_4a0.position.z = 10.0;
  local_4a0.normal.x = 0.0;
  local_4a0.normal.y = -1.0;
  local_4a0.normal.z = 0.0;
  local_4a0.uv.x = 0.0;
  local_4a0.uv.y = 1.0;
  local_4a0.uv.z = 0.0;
  local_458.position.x = -10.0;
  local_458.position.y = 10.0;
  local_458.position.z = 10.0;
  local_458.normal.x = 0.0;
  local_458.normal.y = -1.0;
  local_458.normal.z = 0.0;
  local_458.uv.x = 0.0;
  local_458.uv.y = 0.0;
  local_458.uv.z = 0.0;
  local_47c.position.x = -10.0;
  local_47c.position.y = 10.0;
  local_47c.position.z = -10.0;
  local_47c.normal.x = 0.0;
  local_47c.normal.y = -1.0;
  local_47c.normal.z = 0.0;
  local_47c.uv.x = 1.0;
  local_47c.uv.y = 0.0;
  local_47c.uv.z = 0.0;
  local_4b0 = BuildSingleQuadMesh(pIVar3,(SkyboxVertex *)local_434,&local_4a0,&local_458,&local_47c)
  ;
  pIVar3 = pIVar2;
  std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
            ((vector<aiMesh*,std::allocator<aiMesh*>> *)pIVar2,&local_4b0);
  *(int *)(*(long *)(*(long *)&(pIVar2->super_BaseImporter).importerUnits._M_t._M_impl + -8) + 0xe8)
       = (int)((ulong)((long)(materials->
                             super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(materials->
                            super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl
                            .super__Vector_impl_data._M_start) >> 3) + -2;
  local_434._0_4_ = 0x41200000;
  local_434[4] = '\0';
  local_434[5] = '\0';
  local_434[6] = ' ';
  local_434[7] = -0x3f;
  local_434[8] = '\0';
  local_434[9] = '\0';
  local_434[10] = ' ';
  local_434[0xb] = 'A';
  local_434[0xc] = '\0';
  local_434[0xd] = '\0';
  local_434[0xe] = '\0';
  local_434[0xf] = '\0';
  local_434._16_4_ = 1.0;
  fStack_420 = 0.0;
  fStack_41c = 0.0;
  fStack_418 = 0.0;
  local_414 = 0.0;
  local_4a0.position.x = 10.0;
  local_4a0.position.y = -10.0;
  local_4a0.position.z = -10.0;
  local_4a0.normal.x = 0.0;
  local_4a0.normal.y = 1.0;
  local_4a0.normal.z = 0.0;
  local_4a0.uv.x = 1.0;
  local_4a0.uv.y = 0.0;
  local_4a0.uv.z = 0.0;
  local_458.position.x = -10.0;
  local_458.position.y = -10.0;
  local_458.position.z = -10.0;
  local_458.normal.x = 0.0;
  local_458.normal.y = 1.0;
  local_458.normal.z = 0.0;
  local_458.uv.x = 1.0;
  local_458.uv.y = 1.0;
  local_458.uv.z = 0.0;
  local_47c.position.x = -10.0;
  local_47c.position.y = -10.0;
  local_47c.position.z = 10.0;
  local_47c.normal.x = 0.0;
  local_47c.normal.y = 1.0;
  local_47c.normal.z = 0.0;
  local_47c.uv.x = 0.0;
  local_47c.uv.y = 1.0;
  local_47c.uv.z = 0.0;
  local_4b0 = BuildSingleQuadMesh(pIVar3,(SkyboxVertex *)local_434,&local_4a0,&local_458,&local_47c)
  ;
  std::vector<aiMesh*,std::allocator<aiMesh*>>::emplace_back<aiMesh*>
            ((vector<aiMesh*,std::allocator<aiMesh*>> *)pIVar2,&local_4b0);
  *(int *)(*(long *)(*(long *)&(pIVar2->super_BaseImporter).importerUnits._M_t._M_impl + -8) + 0xe8)
       = (int)((ulong)((long)(materials->
                             super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(materials->
                            super__Vector_base<aiMaterial_*,_std::allocator<aiMaterial_*>_>)._M_impl
                            .super__Vector_impl_data._M_start) >> 3) + -1;
  return;
}

Assistant:

void IRRImporter::BuildSkybox(std::vector<aiMesh*>& meshes, std::vector<aiMaterial*> materials)
{
    // Update the material of the skybox - replace the name and disable shading for skyboxes.
    for (unsigned int i = 0; i < 6;++i) {
        aiMaterial* out = ( aiMaterial* ) (*(materials.end()-(6-i)));

        aiString s;
        s.length = ::ai_snprintf( s.data, MAXLEN, "SkyboxSide_%u",i );
        out->AddProperty(&s,AI_MATKEY_NAME);

        int shading = aiShadingMode_NoShading;
        out->AddProperty(&shading,1,AI_MATKEY_SHADING_MODEL);
    }

    // Skyboxes are much more difficult. They are represented
    // by six single planes with different textures, so we'll
    // need to build six meshes.

    const ai_real l = 10.0; // the size used by Irrlicht

    // FRONT SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex(-l,-l,-l,  0, 0, 1,   1.0,1.0),
        SkyboxVertex( l,-l,-l,  0, 0, 1,   0.0,1.0),
        SkyboxVertex( l, l,-l,  0, 0, 1,   0.0,0.0),
        SkyboxVertex(-l, l,-l,  0, 0, 1,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-6u);

    // LEFT SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex( l,-l,-l,  -1, 0, 0,   1.0,1.0),
        SkyboxVertex( l,-l, l,  -1, 0, 0,   0.0,1.0),
        SkyboxVertex( l, l, l,  -1, 0, 0,   0.0,0.0),
        SkyboxVertex( l, l,-l,  -1, 0, 0,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-5u);

    // BACK SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex( l,-l, l,  0, 0, -1,   1.0,1.0),
        SkyboxVertex(-l,-l, l,  0, 0, -1,   0.0,1.0),
        SkyboxVertex(-l, l, l,  0, 0, -1,   0.0,0.0),
        SkyboxVertex( l, l, l,  0, 0, -1,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-4u);

    // RIGHT SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex(-l,-l, l,  1, 0, 0,   1.0,1.0),
        SkyboxVertex(-l,-l,-l,  1, 0, 0,   0.0,1.0),
        SkyboxVertex(-l, l,-l,  1, 0, 0,   0.0,0.0),
        SkyboxVertex(-l, l, l,  1, 0, 0,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-3u);

    // TOP SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex( l, l,-l,  0, -1, 0,   1.0,1.0),
        SkyboxVertex( l, l, l,  0, -1, 0,   0.0,1.0),
        SkyboxVertex(-l, l, l,  0, -1, 0,   0.0,0.0),
        SkyboxVertex(-l, l,-l,  0, -1, 0,   1.0,0.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-2u);

    // BOTTOM SIDE
    meshes.push_back( BuildSingleQuadMesh(
        SkyboxVertex( l,-l, l,  0,  1, 0,   0.0,0.0),
        SkyboxVertex( l,-l,-l,  0,  1, 0,   1.0,0.0),
        SkyboxVertex(-l,-l,-l,  0,  1, 0,   1.0,1.0),
        SkyboxVertex(-l,-l, l,  0,  1, 0,   0.0,1.0)) );
    meshes.back()->mMaterialIndex = static_cast<unsigned int>(materials.size()-1u);
}